

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void addModuleArgument(Parse *pParse,Table *pTable,char *zArg)

{
  int iVar1;
  sqlite3 *db;
  char **ppcVar2;
  
  iVar1 = pTable->nModuleArg;
  db = pParse->db;
  if (db->aLimit[2] <= iVar1 + 3) {
    sqlite3ErrorMsg(pParse,"too many columns on %s",pTable->zName);
  }
  ppcVar2 = (char **)sqlite3DbRealloc(db,pTable->azModuleArg,(long)iVar1 * 8 + 0x10);
  if (ppcVar2 == (char **)0x0) {
    if (zArg != (char *)0x0) {
      sqlite3DbFreeNN(db,zArg);
      return;
    }
  }
  else {
    iVar1 = pTable->nModuleArg;
    pTable->nModuleArg = iVar1 + 1;
    ppcVar2[iVar1] = zArg;
    ppcVar2[(long)iVar1 + 1] = (char *)0x0;
    pTable->azModuleArg = ppcVar2;
  }
  return;
}

Assistant:

static void addModuleArgument(Parse *pParse, Table *pTable, char *zArg){
  sqlite3_int64 nBytes = sizeof(char *)*(2+pTable->nModuleArg);
  char **azModuleArg;
  sqlite3 *db = pParse->db;
  if( pTable->nModuleArg+3>=db->aLimit[SQLITE_LIMIT_COLUMN] ){
    sqlite3ErrorMsg(pParse, "too many columns on %s", pTable->zName);
  }
  azModuleArg = sqlite3DbRealloc(db, pTable->azModuleArg, nBytes);
  if( azModuleArg==0 ){
    sqlite3DbFree(db, zArg);
  }else{
    int i = pTable->nModuleArg++;
    azModuleArg[i] = zArg;
    azModuleArg[i+1] = 0;
    pTable->azModuleArg = azModuleArg;
  }
}